

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakHashtimes4.c
# Opt level: O0

HashReturn
Keccak_HashInitializetimes4
          (Keccak_HashInstancetimes4 *instance,uint rate,uint capacity,uint hashbitlen,
          uchar delimitedSuffix)

{
  undefined4 in_ECX;
  long in_RDI;
  char in_R8B;
  HashReturn result;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (in_R8B == '\0') {
    local_4 = KECCAK_FAIL;
  }
  else {
    local_4 = KeccakWidth1600times4_SpongeInitialize
                        ((KeccakWidth1600times4_SpongeInstance *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0,0x15c892);
    if (local_4 == KECCAK_SUCCESS) {
      *(undefined4 *)(in_RDI + 0x32c) = in_ECX;
      *(char *)(in_RDI + 0x330) = in_R8B;
      local_4 = KECCAK_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

HashReturn Keccak_HashInitializetimes4(Keccak_HashInstancetimes4 *instance, unsigned int rate, unsigned int capacity, unsigned int hashbitlen, unsigned char delimitedSuffix)
{
    HashReturn result;

    if (delimitedSuffix == 0)
        return KECCAK_FAIL;
    result = (HashReturn)KeccakWidth1600times4_SpongeInitialize(&instance->sponge, rate, capacity);
    if (result != KECCAK_SUCCESS)
        return result;
    instance->fixedOutputLength = hashbitlen;
    instance->delimitedSuffix = delimitedSuffix;
    return KECCAK_SUCCESS;
}